

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryInt::test
          (ShaderBitfieldOperationCaseUnaryInt *this,Data *data)

{
  GLint GVar1;
  int local_24;
  GLint expected;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseUnaryInt *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->m_components <= local_24) {
      return true;
    }
    GVar1 = (*this->m_func)(data->inIvec4[local_24]);
    if (data->outIvec4[local_24] != GVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = m_func(data->inIvec4[i]);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}